

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_CPort_Reg8_Data8(VGMPlayer *this)

{
  CHIP_DEVICE *cDev_00;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  UINT8 chipType;
  VGMPlayer *this_local;
  
  cDev_00 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                         0x9f < this->_fileData[this->_filePos]);
  if ((cDev_00 != (CHIP_DEVICE *)0x0) && (cDev_00->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    SendYMCommand(cDev_00,this->_fileData[this->_filePos] & 1,
                  this->_fileData[(ulong)this->_filePos + 1],
                  this->_fileData[(ulong)this->_filePos + 2]);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_CPort_Reg8_Data8(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x00] >= 0xA0) ? 1 : 0;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	SendYMCommand(cDev, fData[0x00] & 0x01, fData[0x01], fData[0x02]);
	return;
}